

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O3

void ShoveChatStr(char *str,BYTE who)

{
  char *__s1;
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  AInventory *pAVar7;
  int *piVar8;
  ulong uVar9;
  char *tail;
  FString substBuff;
  FString local_48;
  undefined8 *local_40;
  int *local_38;
  
  if (str == (char *)0x0) {
    return;
  }
  if (*str == '\0') {
    return;
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_48.Chars = FString::NullString.Nothing;
  if (((*str == '/') && ((byte)(str[1] | 0x20U) == 0x6d)) && ((byte)(str[2] | 0x20U) == 0x65)) {
    str = str + 3;
    who = who | 2;
  }
  Net_WriteByte('\f');
  Net_WriteByte(who);
  if (chat_substitution.Value == true) {
    lVar5 = (long)consoleplayer;
    puVar1 = *(undefined8 **)(&DAT_00a60360 + lVar5 * 0x2a0);
    FString::operator=(&local_48,(char *)"");
    pcVar6 = strchr(str,0x24);
    if (pcVar6 != (char *)0x0) {
      local_40 = &players + lVar5 * 0x54;
      local_38 = &DAT_00a60328 + lVar5 * 0xa8;
      tail = str;
      do {
        FString::AppendCStrPart(&local_48,tail,(long)pcVar6 - (long)tail);
        __s1 = pcVar6 + 1;
        cVar3 = pcVar6[1];
        tail = __s1;
        if (cVar3 == '\0') {
LAB_004b0226:
          FString::operator+=(&local_48,'$');
          tail = tail + (*tail == '$');
        }
        else {
          lVar5 = 1;
          do {
            iVar4 = isalpha((int)cVar3);
            if (iVar4 == 0) break;
            cVar3 = pcVar6[lVar5 + 1];
            lVar5 = lVar5 + 1;
          } while (cVar3 != '\0');
          tail = pcVar6 + lVar5;
          switch(lVar5 - 1U) {
          case 0:
            goto LAB_004b0226;
          default:
            FString::operator+=(&local_48,'$');
            FString::AppendCStrPart(&local_48,__s1,lVar5 - 1U);
            break;
          case 4:
            iVar4 = strncasecmp(__s1,"ammo",4);
            if (iVar4 == 0) {
              pcVar6 = "no ammo";
              if (puVar1 != (undefined8 *)0x0) {
                puVar2 = (undefined8 *)puVar1[0xac];
                pcVar6 = "no ammo";
                if (puVar2 != (undefined8 *)0x0) {
                  if ((*(byte *)(puVar2 + 4) & 0x20) == 0) {
                    lVar5 = puVar2[1];
                    if (lVar5 == 0) {
                      lVar5 = (**(code **)*puVar2)(puVar2);
                      puVar2[1] = lVar5;
                    }
                    FString::AppendFormat
                              (&local_48,"%s",FName::NameData.NameArray[*(int *)(lVar5 + 0x88)].Text
                              );
                    puVar2 = (undefined8 *)puVar1[0xad];
                    if (puVar2 != (undefined8 *)0x0) {
                      if ((*(byte *)(puVar2 + 4) & 0x20) == 0) {
                        lVar5 = puVar2[1];
                        if (lVar5 == 0) {
                          lVar5 = (**(code **)*puVar2)(puVar2);
                          puVar2[1] = lVar5;
                        }
                        FString::AppendFormat
                                  (&local_48,"/%s",
                                   FName::NameData.NameArray[*(int *)(lVar5 + 0x88)].Text);
                      }
                      else {
                        puVar1[0xad] = 0;
                      }
                    }
                    break;
                  }
                  puVar1[0xac] = 0;
                  pcVar6 = "no ammo";
                }
              }
LAB_004b04c6:
              FString::operator+=(&local_48,pcVar6);
            }
            break;
          case 5:
            iVar4 = strncasecmp(__s1,"armor",5);
            if (iVar4 == 0) {
              pAVar7 = AActor::FindInventory
                                 ((AActor *)*local_40,
                                  (PClassActor *)ABasicArmor::RegistrationInfo.MyClass,false);
              if (pAVar7 != (AInventory *)0x0) {
                piVar8 = &pAVar7->Amount;
                pcVar6 = "%d";
                goto LAB_004b0517;
              }
              uVar9 = 0;
              pcVar6 = "%d";
LAB_004b0519:
              FString::AppendFormat(&local_48,pcVar6,uVar9);
            }
            break;
          case 6:
            iVar4 = strncasecmp(__s1,"health",6);
            pcVar6 = "%d";
            piVar8 = local_38;
            if (iVar4 == 0) {
LAB_004b0517:
              uVar9 = (ulong)(uint)*piVar8;
              goto LAB_004b0519;
            }
            iVar4 = strncasecmp(__s1,"weapon",6);
            if (iVar4 == 0) {
              pcVar6 = "no weapon";
              if (puVar1 == (undefined8 *)0x0) goto LAB_004b04c6;
              lVar5 = puVar1[1];
              if (lVar5 == 0) {
                lVar5 = (**(code **)*puVar1)();
                puVar1[1] = lVar5;
              }
              FString::operator+=(&local_48,FName::NameData.NameArray[*(int *)(lVar5 + 0x88)].Text);
            }
            break;
          case 9:
            iVar4 = strncasecmp(__s1,"ammocount",9);
            if (iVar4 == 0) {
              if (puVar1 == (undefined8 *)0x0) {
                FString::operator+=(&local_48,'0');
              }
              else {
                lVar5 = puVar1[0xac];
                uVar9 = 0;
                if (lVar5 != 0) {
                  if ((*(byte *)(lVar5 + 0x20) & 0x20) == 0) {
                    uVar9 = (ulong)*(uint *)(lVar5 + 0x4a8);
                  }
                  else {
                    puVar1[0xac] = 0;
                  }
                }
                FString::AppendFormat(&local_48,"%d",uVar9);
                lVar5 = puVar1[0xad];
                if (lVar5 != 0) {
                  if ((*(byte *)(lVar5 + 0x20) & 0x20) == 0) {
                    pcVar6 = "/%d";
                    piVar8 = (int *)(lVar5 + 0x4a8);
                    goto LAB_004b0517;
                  }
                  puVar1[0xad] = 0;
                }
              }
            }
          }
        }
        pcVar6 = strchr(tail,0x24);
      } while (pcVar6 != (char *)0x0);
      if (tail != str) {
        FString::operator+=(&local_48,tail);
        Net_WriteString(local_48.Chars);
        goto LAB_004b056e;
      }
    }
  }
  Net_WriteString(str);
LAB_004b056e:
  FString::~FString(&local_48);
  return;
}

Assistant:

static void ShoveChatStr (const char *str, BYTE who)
{
	// Don't send empty messages
	if (str == NULL || str[0] == '\0')
		return;

	FString substBuff;

	if (str[0] == '/' &&
		(str[1] == 'm' || str[1] == 'M') &&
		(str[2] == 'e' || str[2] == 'E'))
	{ // This is a /me message
		str += 3;
		who |= 2;
	}

	Net_WriteByte (DEM_SAY);
	Net_WriteByte (who);

	if (!chat_substitution || !DoSubstitution (substBuff, str))
	{
		Net_WriteString (str);
	}
	else
	{
		Net_WriteString (substBuff);
	}
}